

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall BailOutInfo::Clear(BailOutInfo *this,JitArenaAllocator *allocator)

{
  CapturedValues *pCVar1;
  Type_conflict pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Type_conflict *ppSVar7;
  long *plVar8;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar9
  ;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  code *local_160;
  code *local_140;
  code *local_120;
  code *local_100;
  JitArenaAllocator *allocator_local;
  BailOutInfo *this_local;
  FreeFuncType freeFunc_2;
  NodeBase *next_2;
  NodeBase *current_2;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  FreeFuncType freeFunc_3;
  NodeBase *next_3;
  NodeBase *current_3;
  FreeFuncType freeFunc_1;
  NodeBase *next_1;
  NodeBase *current_1;
  
  if ((this->bailOutRecord != (BailOutRecord *)0x0) &&
     (bVar4 = OnlyHasLazyBailOut(this->bailOutRecord->bailOutKind), !bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x60,
                       "(bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind))"
                       ,
                       "bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind)"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((this->capturedValues != (CapturedValues *)0x0) &&
     (uVar5 = CapturedValues::DecrementRefCount(this->capturedValues), uVar5 == 0)) {
    pCVar1 = this->capturedValues;
    ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                        ((SListNodeBase<Memory::ArenaAllocator> *)pCVar1);
    next = *ppSVar7;
    while (bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead(&pCVar1->constantValues,next), ((bVar4 ^ 0xffU) & 1) != 0) {
      ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
      pSVar2 = *ppSVar7;
      local_100 = (code *)Memory::
                          TypeAllocatorFunc<Memory::ArenaAllocator,_JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>_>
                          ::GetFreeFunc();
      plVar8 = (long *)((long)&(allocator->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_Allocator.outOfMemoryFunc + extraout_RDX);
      if (((ulong)local_100 & 1) != 0) {
        local_100 = *(code **)(local_100 + *plVar8 + -1);
      }
      (*local_100)(plVar8,next,0x20);
      next = pSVar2;
    }
    SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
    ::Reset(&pCVar1->constantValues);
    pSVar9 = &this->capturedValues->copyPropSyms;
    ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&pSVar9->super_SListNodeBase<Memory::ArenaAllocator>);
    next_1 = *ppSVar7;
    while (bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead(pSVar9,next_1), ((bVar4 ^ 0xffU) & 1) != 0) {
      ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next(next_1);
      pSVar2 = *ppSVar7;
      local_120 = (code *)Memory::
                          TypeAllocatorFunc<Memory::ArenaAllocator,_JsUtil::KeyValuePair<StackSym_*,_StackSym_*>_>
                          ::GetFreeFunc();
      plVar8 = (long *)((long)&(allocator->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_Allocator.outOfMemoryFunc + extraout_RDX_00);
      if (((ulong)local_120 & 1) != 0) {
        local_120 = *(code **)(local_120 + *plVar8 + -1);
      }
      (*local_120)(plVar8,next_1,0x18);
      next_1 = pSVar2;
    }
    SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>::
    Reset(pSVar9);
    if (this->capturedValues->argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (allocator,this->capturedValues->argObjSyms);
    }
    Memory::DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,CapturedValues>
              (allocator,this->capturedValues);
  }
  if (this->usedCapturedValues != (CapturedValues *)0x0) {
    if (this->usedCapturedValues->refCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x70,"(this->usedCapturedValues->refCount == 0)",
                         "this->usedCapturedValues->refCount == 0");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pCVar1 = this->usedCapturedValues;
    ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                        ((SListNodeBase<Memory::ArenaAllocator> *)pCVar1);
    next_2 = *ppSVar7;
    while (bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead(&pCVar1->constantValues,next_2), ((bVar4 ^ 0xffU) & 1) != 0) {
      ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next(next_2);
      pSVar2 = *ppSVar7;
      local_140 = (code *)Memory::
                          TypeAllocatorFunc<Memory::ArenaAllocator,_JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>_>
                          ::GetFreeFunc();
      plVar8 = (long *)((long)&(allocator->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_Allocator.outOfMemoryFunc + extraout_RDX_01);
      if (((ulong)local_140 & 1) != 0) {
        local_140 = *(code **)(local_140 + *plVar8 + -1);
      }
      (*local_140)(plVar8,next_2,0x20);
      next_2 = pSVar2;
    }
    SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
    ::Reset(&pCVar1->constantValues);
    pSVar9 = &this->usedCapturedValues->copyPropSyms;
    ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&pSVar9->super_SListNodeBase<Memory::ArenaAllocator>);
    next_3 = *ppSVar7;
    while (bVar4 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead(pSVar9,next_3), ((bVar4 ^ 0xffU) & 1) != 0) {
      ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next(next_3);
      pSVar2 = *ppSVar7;
      local_160 = (code *)Memory::
                          TypeAllocatorFunc<Memory::ArenaAllocator,_JsUtil::KeyValuePair<StackSym_*,_StackSym_*>_>
                          ::GetFreeFunc();
      plVar8 = (long *)((long)&(allocator->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_Allocator.outOfMemoryFunc + extraout_RDX_02);
      if (((ulong)local_160 & 1) != 0) {
        local_160 = *(code **)(local_160 + *plVar8 + -1);
      }
      (*local_160)(plVar8,next_3,0x18);
      next_3 = pSVar2;
    }
    SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>::
    Reset(pSVar9);
    if (this->usedCapturedValues->argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (allocator,this->usedCapturedValues->argObjSyms);
    }
    Memory::DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,CapturedValues>
              (allocator,this->usedCapturedValues);
  }
  if (this->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->byteCodeUpwardExposedUsed);
  }
  if (this->startCallInfo != (StartCallInfo *)0x0) {
    if (this->argOutSyms == (StackSym **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x82,"(argOutSyms)","argOutSyms");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    Memory::DeleteArray<Memory::JitArenaAllocator,unsigned_int>
              (allocator,(ulong)this->startCallCount,this->startCallInfo);
    Memory::DeleteArray<Memory::JitArenaAllocator,StackSym*>
              (allocator,(ulong)this->totalOutParamCount,this->argOutSyms);
  }
  if (this->liveVarSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->liveVarSyms);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->liveLosslessInt32Syms);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->liveFloat64Syms);
  }
  return;
}

Assistant:

void
BailOutInfo::Clear(JitArenaAllocator * allocator)
{
    // Previously, we don't have a case where we delete bailout info after we allocated the bailout record.
    // However, since lazy bailouts can now be attached on helper call instructions, and those instructions
    // might sometimes be removed in Peeps, we will hit those cases. Make sure that in such cases, lazy bailout
    // is the only bailout reason we have.
    Assert(bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind));
    if (this->capturedValues && this->capturedValues->DecrementRefCount() == 0)
    {
        this->capturedValues->constantValues.Clear(allocator);
        this->capturedValues->copyPropSyms.Clear(allocator);

        if (this->capturedValues->argObjSyms)
        {
            JitAdelete(allocator, this->capturedValues->argObjSyms);
        }

        JitAdelete(allocator, this->capturedValues);
    }

    if (this->usedCapturedValues)
    {
        Assert(this->usedCapturedValues->refCount == 0);
        this->usedCapturedValues->constantValues.Clear(allocator);
        this->usedCapturedValues->copyPropSyms.Clear(allocator);

        if (this->usedCapturedValues->argObjSyms)
        {
            JitAdelete(allocator, this->usedCapturedValues->argObjSyms);
        }

        JitAdelete(allocator, this->usedCapturedValues);
    }

    if (byteCodeUpwardExposedUsed)
    {
        JitAdelete(allocator, byteCodeUpwardExposedUsed);
    }
    if (startCallInfo)
    {
        Assert(argOutSyms);
        JitAdeleteArray(allocator, startCallCount, startCallInfo);
        JitAdeleteArray(allocator, totalOutParamCount, argOutSyms);
    }
    if (liveVarSyms)
    {
        JitAdelete(allocator, liveVarSyms);
        JitAdelete(allocator, liveLosslessInt32Syms);
        JitAdelete(allocator, liveFloat64Syms);
    }
#ifdef _M_IX86
    if (outParamFrameAdjustArgSlot)
    {
        JitAdelete(allocator, outParamFrameAdjustArgSlot);
    }
#endif
}